

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int-var-el.cpp
# Opt level: O0

bool __thiscall IntVarEL::setVal(IntVarEL *this,int64_t v,Reason r,bool channel)

{
  bool bVar1;
  int iVar2;
  byte in_CL;
  IntVar *in_RDX;
  long in_RSI;
  long *in_RDI;
  IntVarEL *unaff_retaddr;
  undefined7 in_stack_00000010;
  IntVar *in_stack_ffffffffffffffd0;
  long *v_00;
  int o;
  int in_stack_fffffffffffffffc;
  
  v_00 = in_RDI;
  if ((in_CL & 1) != 0) {
    in_stack_ffffffffffffffd0 = in_RDX;
    (**(code **)(*in_RDI + 0x68))(in_RDI,in_RSI,1);
    in_RDX = in_stack_ffffffffffffffd0;
    SAT::cEnqueue((SAT *)CONCAT17(channel,in_stack_00000010),this._4_4_,(Reason)v);
  }
  bVar1 = IntVar::indomain(in_RDX,(int64_t)v_00);
  o = (int)((ulong)v_00 >> 0x20);
  if (bVar1) {
    *(uint *)(in_RDI + 8) = *(uint *)(in_RDI + 8) | 9;
    channelFix(unaff_retaddr,in_stack_fffffffffffffffc);
    iVar2 = Tint::operator_cast_to_int((Tint *)((long)in_RDI + 0xc));
    if (iVar2 < in_RSI) {
      Tint::operator=((Tint *)in_RDX,o);
      *(uint *)(in_RDI + 8) = *(uint *)(in_RDI + 8) | 2;
    }
    iVar2 = Tint::operator_cast_to_int((Tint *)(in_RDI + 2));
    if (in_RSI < iVar2) {
      Tint::operator=((Tint *)in_RDX,o);
      *(uint *)(in_RDI + 8) = *(uint *)(in_RDI + 8) | 4;
    }
    IntVar::pushInQueue(in_stack_ffffffffffffffd0);
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool IntVarEL::setVal(int64_t v, Reason r, bool channel) {
	assert(setValNotR(v));
	if (channel) {
		sat.cEnqueue(getLit(v, LR_EQ), r);
	}
	if (!indomain(v)) {
		assert(sat.confl);
		return false;
	}
	changes |= EVENT_C | EVENT_F;
	channelFix(static_cast<int>(v));
	if (min < v) {
		min = static_cast<int>(v);
		changes |= EVENT_L;
	}
	if (max > v) {
		max = static_cast<int>(v);
		changes |= EVENT_U;
	}
#if INT_DOMAIN_LIST
	vals_count = 1;
#endif
	pushInQueue();
	return true;
}